

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O3

void __thiscall cmGccDepfileLexerHelper::newEntry(cmGccDepfileLexerHelper *this)

{
  pointer pbVar1;
  iterator __position;
  pointer pcVar2;
  
  if (this->HelperState == Rule) {
    __position._M_current =
         (this->Content).
         super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((this->Content).
        super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
        super__Vector_impl_data._M_start != __position._M_current) {
      pbVar1 = __position._M_current[-1].rules.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current[-1].rules.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == pbVar1) {
        return;
      }
      if (pbVar1[-1]._M_string_length == 0) {
        return;
      }
      this->HelperState = Failed;
      return;
    }
  }
  else {
    __position._M_current =
         (this->Content).
         super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  this->HelperState = Rule;
  if (__position._M_current ==
      (this->Content).
      super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::_M_realloc_insert<>
              (&this->Content,__position);
    pcVar2 = (this->Content).
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
             .super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->paths).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((__position._M_current)->paths).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((__position._M_current)->rules).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((__position._M_current)->paths).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((__position._M_current)->rules).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((__position._M_current)->rules).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar2 = (this->Content).
             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
    (this->Content).super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar2;
  }
  pbVar1 = pcVar2[-1].rules.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pcVar2[-1].rules.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != pbVar1) && (pbVar1[-1]._M_string_length == 0)) {
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&pcVar2[-1].rules);
  return;
}

Assistant:

void cmGccDepfileLexerHelper::newEntry()
{
  if (this->HelperState == State::Rule && !this->Content.empty()) {
    if (!this->Content.back().rules.empty() &&
        !this->Content.back().rules.back().empty()) {
      this->HelperState = State::Failed;
    }
    return;
  }
  this->HelperState = State::Rule;
  this->Content.emplace_back();
  this->newRule();
}